

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

void __thiscall
supermap::
Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
::add(Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
      *this,Key<30UL> *key,MaybeRemovedValue<supermap::ByteArray<100UL>_> *value)

{
  bool bVar1;
  KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  *pKVar2;
  ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long> *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_> *pKVar12;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> __dest;
  long lVar13;
  undefined4 extraout_var;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_> *local_50
  ;
  unsigned_long local_48;
  undefined8 uStack_40;
  
  pKVar2 = (this->diskDataStorage_)._M_t.
           super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
           ._M_head_impl;
  pKVar12 = (KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>
             *)operator_new(0x30);
  __dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Head_base<0UL,_unsigned_char_*,_false>)operator_new__(100);
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x50) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x58) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x40) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x48) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x30) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x38) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x20) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x28) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x10) =
       0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x18) =
       0;
  *(undefined8 *)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = 0;
  *(undefined8 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)((long)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x60) =
       0;
  memcpy((void *)__dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
         (uchar *)(value->value).data_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>,100);
  bVar1 = value->removed;
  uVar4 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 4);
  uVar5 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 8);
  uVar6 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0xc);
  uVar7 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0xe);
  uVar8 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0x12);
  uVar9 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0x16);
  uVar10 = *(undefined4 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0x1a);
  *(undefined4 *)(pKVar12->key).super_array<unsigned_char,_30UL>._M_elems =
       *(undefined4 *)(key->super_array<unsigned_char,_30UL>)._M_elems;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 4) = uVar4;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 8) = uVar5;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 0xc) = uVar6;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 0xe) = uVar7;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 0x12) = uVar8;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 0x16) = uVar9;
  *(undefined4 *)((pKVar12->key).super_array<unsigned_char,_30UL>._M_elems + 0x1a) = uVar10;
  (pKVar12->value).value.data_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false> =
       __dest.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (pKVar12->value).removed = bVar1;
  local_50 = pKVar12;
  (*(code *)*(pKVar2->
             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
             ).
             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
             ._vptr_OrderedStorage)(pKVar2);
  if (local_50 !=
      (KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_> *)
      0x0) {
    std::
    default_delete<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>_>
    ::operator()((default_delete<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>_>
                  *)&local_50,local_50);
  }
  pEVar3 = (this->innerStorage_)._M_t.
           super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_*,_false>
           ._M_head_impl;
  lVar13 = (**(code **)(*(long *)&(((this->diskDataStorage_)._M_t.
                                    super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                                    .
                                    super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
                                   ._M_head_impl)->
                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
                                  ).
                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
                       + 8))();
  local_50 = (KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>
              *)(lVar13 + -1);
  (**(pEVar3->super_KeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>).
     _vptr_KeyValueStorage)(pEVar3,key);
  iVar11 = (*(((this->innerStorage_)._M_t.
               super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_>_>
               .
               super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>_*,_false>
              ._M_head_impl)->
             super_KeyValueStorage<supermap::Key<30UL>,_unsigned_long,_unsigned_long>).
             _vptr_KeyValueStorage[3])();
  if (this->keyIndexBatchSize_ <= CONCAT44(extraout_var,iVar11)) {
    dropRamIndexToDisk(this);
  }
  pKVar2 = (this->diskDataStorage_)._M_t.
           super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
           ._M_head_impl;
  local_48 = (pKVar2->notSortedStorage_).
             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
             .
             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
             .register_.count_;
  uStack_40 = 0;
  uVar14 = (**(code **)(*(long *)&(pKVar2->
                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
                                  ).
                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>_>,_unsigned_long,_void>
                       + 8))();
  auVar15._8_4_ = (int)(local_48 >> 0x20);
  auVar15._0_8_ = local_48;
  auVar15._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)((ulong)uVar14 >> 0x20);
  auVar16._0_8_ = uVar14;
  auVar16._12_4_ = 0x45300000;
  if (this->maxNotSortedPart_ <=
      ((auVar15._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) /
      ((auVar16._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0))) {
    dropRamIndexToDisk(this);
    shrinkDataStorage(this);
  }
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        diskDataStorage_->append(std::make_unique<KeyVal>(key, value));
        innerStorage_->add(key, diskDataStorage_->getLastElementIndex());
        if (innerStorage_->getUpperSizeBound() >= keyIndexBatchSize_) {
            dropRamIndexToDisk();
        }

        IndexT notSortedStorageSize = diskDataStorage_->getNotSortedItemsCount();
        IndexT totalStorageSize = diskDataStorage_->getItemsCount();

        double notSortedPart = static_cast<double>(notSortedStorageSize) / static_cast<double>(totalStorageSize);

        if (notSortedPart >= maxNotSortedPart_) {
            dropRamIndexToDisk();
            shrinkDataStorage();
        }
    }